

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O2

int s2pred::UnperturbedSign(S2Point *a,S2Point *b,S2Point *c)

{
  int iVar1;
  Vector3_d VStack_38;
  
  Vector3<double>::CrossProd(a,b);
  iVar1 = TriageSign(a,b,c,&VStack_38);
  if (iVar1 == 0) {
    iVar1 = ExpensiveSign(a,b,c,false);
  }
  return iVar1;
}

Assistant:

int UnperturbedSign(const S2Point& a, const S2Point& b, const S2Point& c) {
  int sign = TriageSign(a, b, c, a.CrossProd(b));
  if (sign == 0) sign = ExpensiveSign(a, b, c, false /*perturb*/);
  return sign;
}